

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::ConfigFlagsTable::TransferAcronymFlagConfiguration(ConfigFlagsTable *this)

{
  bool bVar1;
  ConfigFlagsTable *this_local;
  
  bVar1 = IsEnabled(this,DynamicProfileCacheFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,DpcFlag), bVar1)) {
    Enable(this,DynamicProfileCacheFlag);
    String::operator=(&this->DynamicProfileCache,&this->Dpc);
  }
  bVar1 = IsEnabled(this,DynamicProfileInputFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,DpiFlag), bVar1)) {
    Enable(this,DynamicProfileInputFlag);
    String::operator=(&this->DynamicProfileInput,&this->Dpi);
  }
  bVar1 = IsEnabled(this,InlineCountMaxInLoopBodiesFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,icminlbFlag), bVar1)) {
    Enable(this,InlineCountMaxInLoopBodiesFlag);
    this->InlineCountMaxInLoopBodies = this->icminlb;
  }
  bVar1 = IsEnabled(this,InlineInLoopBodyScaleDownFactorFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,iilbsdfFlag), bVar1)) {
    Enable(this,InlineInLoopBodyScaleDownFactorFlag);
    this->InlineInLoopBodyScaleDownFactor = this->iilbsdf;
  }
  bVar1 = IsEnabled(this,LoopInterpretCountFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,licFlag), bVar1)) {
    Enable(this,LoopInterpretCountFlag);
    this->LoopInterpretCount = this->lic;
  }
  bVar1 = IsEnabled(this,MaxInterpretCountFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,MicFlag), bVar1)) {
    Enable(this,MaxInterpretCountFlag);
    this->MaxInterpretCount = this->Mic;
  }
  bVar1 = IsEnabled(this,MaxSimpleJitRunCountFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,MsjrcFlag), bVar1)) {
    Enable(this,MaxSimpleJitRunCountFlag);
    this->MaxSimpleJitRunCount = this->Msjrc;
  }
  bVar1 = IsEnabled(this,MinMemOpCountFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,MmocFlag), bVar1)) {
    Enable(this,MinMemOpCountFlag);
    this->MinMemOpCount = this->Mmoc;
  }
  bVar1 = IsEnabled(this,MaxTemplatizedJitRunCountFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,MtjrcFlag), bVar1)) {
    Enable(this,MaxTemplatizedJitRunCountFlag);
    this->MaxTemplatizedJitRunCount = this->Mtjrc;
  }
  bVar1 = IsEnabled(this,MaxAsmJsInterpreterRunCountFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,MaicFlag), bVar1)) {
    Enable(this,MaxAsmJsInterpreterRunCountFlag);
    this->MaxAsmJsInterpreterRunCount = this->Maic;
  }
  bVar1 = IsEnabled(this,ExecutionModeLimitsFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,EmlFlag), bVar1)) {
    Enable(this,ExecutionModeLimitsFlag);
    String::operator=(&this->ExecutionModeLimits,&this->Eml);
  }
  bVar1 = IsEnabled(this,EnforceExecutionModeLimitsFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,EemlFlag), bVar1)) {
    Enable(this,EnforceExecutionModeLimitsFlag);
    this->EnforceExecutionModeLimits = (Boolean)(this->Eeml & 1);
  }
  bVar1 = IsEnabled(this,SimpleJitAfterFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,SjaFlag), bVar1)) {
    Enable(this,SimpleJitAfterFlag);
    this->SimpleJitAfter = this->Sja;
  }
  bVar1 = IsEnabled(this,FullJitAfterFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,FjaFlag), bVar1)) {
    Enable(this,FullJitAfterFlag);
    this->FullJitAfter = this->Fja;
  }
  bVar1 = IsEnabled(this,EnableConcurrentSweepAllocFlag);
  if ((!bVar1) && (bVar1 = IsEnabled(this,ecsaFlag), bVar1)) {
    Enable(this,EnableConcurrentSweepAllocFlag);
    this->EnableConcurrentSweepAlloc = (Boolean)(this->ecsa & 1);
  }
  return;
}

Assistant:

void ConfigFlagsTable::TransferAcronymFlagConfiguration()
    {
        // Transfer acronym flag configuration into the corresponding actual flag
    #define FLAG(...)
    #define FLAGNRA(Type, Name, Acronym, ...) \
        if(!IsEnabled(Name##Flag) && IsEnabled(Acronym##Flag)) \
        { \
            Enable(Name##Flag); \
            Name = Acronym; \
        }
    #if ENABLE_DEBUG_CONFIG_OPTIONS
    #define FLAGPRA(Type, ParentName, Name, Acronym, ...) \
        if(!IsEnabled(Name##Flag) && IsEnabled(Acronym##Flag)) \
        { \
            Enable(Name##Flag); \
            Name = Acronym; \
        }
        #define FLAGRA(Type, Name, Acronym, ...) FLAGNRA(Type, Name, Acronym, __VA_ARGS__)
    #endif
    #include "ConfigFlagsList.h"
    }